

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanPartialInternal<duckdb::uhugeint_t,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint64_t uVar1;
  uint64_t uVar2;
  RLEScanState<duckdb::uhugeint_t> *scan_state;
  data_ptr_t pdVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t *puVar6;
  uhugeint_t *data_pointer;
  rle_count_t *index_pointer;
  ulong uVar7;
  bool bVar8;
  uhugeint_t element;
  
  scan_state = (RLEScanState<duckdb::uhugeint_t> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  pdVar3 = BufferHandle::Ptr(&scan_state->handle);
  data_pointer = (uhugeint_t *)(pdVar3 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar3 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<duckdb::uhugeint_t>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar3 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar7 = scan_count + result_offset;
  while( true ) {
    uVar4 = uVar7 - result_offset;
    if (uVar7 < result_offset || uVar4 == 0) {
      return;
    }
    uVar5 = (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry;
    uVar1 = data_pointer[scan_state->entry_pos].lower;
    uVar2 = data_pointer[scan_state->entry_pos].upper;
    if (uVar4 < uVar5) break;
    puVar6 = (uint64_t *)(pdVar3 + result_offset * 0x10);
    uVar4 = uVar5;
    while (bVar8 = uVar4 != 0, uVar4 = uVar4 - 1, bVar8) {
      *puVar6 = uVar1;
      puVar6[1] = uVar2;
      puVar6 = puVar6 + 2;
    }
    scan_state->entry_pos = scan_state->entry_pos + 1;
    result_offset = result_offset + uVar5;
    scan_state->position_in_entry = 0;
  }
  puVar6 = (uint64_t *)(pdVar3 + result_offset * 0x10);
  uVar7 = uVar4;
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    *puVar6 = uVar1;
    puVar6[1] = uVar2;
    puVar6 = puVar6 + 2;
  }
  scan_state->position_in_entry = scan_state->position_in_entry + uVar4;
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}